

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O1

void firebird_plugin(IMaster *master)

{
  ::master = master;
  init((EVP_PKEY_CTX *)master);
  return;
}

Assistant:

void FB_EXPORTED FB_PLUGIN_ENTRY_POINT(IMaster* master)
{
	::master = master;

	try
	{
		init();
	}
	catch (const exception& e)
	{
		//// FIXME: how to report an error here?
		cerr << e.what() << endl;
	}
}